

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O0

void get_msurf_descriptor_haar_unroll_2_12_True(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int row;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  float *in_RSI;
  integral_image *in_RDI;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_x;
  int k_2;
  int gauss_index_k;
  float gauss_s1_y;
  int l_2;
  int gauss_index_l_inc;
  int gauss_index_l;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float *j_arr;
  int j;
  int gauss_index_k_inc;
  int gauss_index_k_start;
  float *i_arr;
  int i;
  float e_c1_p4;
  float e_c1_p3;
  float e_c1_p2;
  float e_c1_p1;
  float e_c1_m1;
  float e_c1_m2;
  float e_c1_m3;
  float e_c1_m4;
  float e_c0_p4;
  float e_c0_p3;
  float e_c0_p2;
  float e_c0_p1;
  float e_c0_m1;
  float e_c0_m2;
  float e_c0_m3;
  float e_c0_m4;
  float s11;
  float s10;
  float s9;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  int sample_x_sub_int_scale11_1;
  int sample_x_sub_int_scale10_1;
  int sample_x_sub_int_scale9_1;
  int sample_x_sub_int_scale8_1;
  int sample_x_sub_int_scale7_1;
  int sample_x_sub_int_scale6_1;
  int sample_x_sub_int_scale5_1;
  int sample_x_sub_int_scale4_1;
  int sample_x_sub_int_scale3_1;
  int sample_x_sub_int_scale2_1;
  int sample_x_sub_int_scale1_1;
  int sample_x_sub_int_scale0_1;
  int k_count11_1;
  int k_count10_1;
  int k_count9_1;
  int k_count8_1;
  int k_count7_1;
  int k_count6_1;
  int k_count5_1;
  int k_count4_1;
  int k_count3_1;
  int k_count2_1;
  int k_count1_1;
  int k_count0_1;
  int k11_1;
  int k10_1;
  int k9_1;
  int k8_1;
  int k7_1;
  int k6_1;
  int k5_1;
  int k4_1;
  int k3_1;
  int k2_1;
  int k1_1;
  int k0_1;
  int k_count_1;
  int k_1;
  int sample_y_sub_int_scale1_1;
  int sample_y_sub_int_scale0_1;
  int l_count1_1;
  int l_count0_1;
  int l1_1;
  int l0_1;
  int l_count_1;
  int l_1;
  int sample_x_sub_int_scale11;
  int sample_x_sub_int_scale10;
  int sample_x_sub_int_scale9;
  int sample_x_sub_int_scale8;
  int sample_x_sub_int_scale7;
  int sample_x_sub_int_scale6;
  int sample_x_sub_int_scale5;
  int sample_x_sub_int_scale4;
  int sample_x_sub_int_scale3;
  int sample_x_sub_int_scale2;
  int sample_x_sub_int_scale1;
  int sample_x_sub_int_scale0;
  float ipoint_x_sub_int_scale_add_k11_mul_scale;
  float ipoint_x_sub_int_scale_add_k10_mul_scale;
  float ipoint_x_sub_int_scale_add_k9_mul_scale;
  float ipoint_x_sub_int_scale_add_k8_mul_scale;
  float ipoint_x_sub_int_scale_add_k7_mul_scale;
  float ipoint_x_sub_int_scale_add_k6_mul_scale;
  float ipoint_x_sub_int_scale_add_k5_mul_scale;
  float ipoint_x_sub_int_scale_add_k4_mul_scale;
  float ipoint_x_sub_int_scale_add_k3_mul_scale;
  float ipoint_x_sub_int_scale_add_k2_mul_scale;
  float ipoint_x_sub_int_scale_add_k1_mul_scale;
  float ipoint_x_sub_int_scale_add_k0_mul_scale;
  int k_count11;
  int k_count10;
  int k_count9;
  int k_count8;
  int k_count7;
  int k_count6;
  int k_count5;
  int k_count4;
  int k_count3;
  int k_count2;
  int k_count1;
  int k_count0;
  int k11;
  int k10;
  int k9;
  int k8;
  int k7;
  int k6;
  int k5;
  int k4;
  int k3;
  int k2;
  int k1;
  int k0;
  int k_count;
  int k;
  int sample_y_sub_int_scale1;
  int sample_y_sub_int_scale0;
  float ipoint_y_sub_int_scale_add_l1_mul_scale;
  float ipoint_y_sub_int_scale_add_l0_mul_scale;
  int l_count1;
  int l_count0;
  int l1;
  int l0;
  int l_count;
  int l;
  int gauss_s2_index;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  int height;
  int width;
  float ipoint_y_sub_int_scale_add_05;
  float ipoint_x_sub_int_scale_add_05;
  float ipoint_y_sub_int_scale;
  float ipoint_x_sub_int_scale;
  float ipoint_y;
  float ipoint_x;
  float g1_factor;
  float scale_squared;
  int int_scale;
  float scale;
  double local_430;
  float *haarY;
  float *haarX;
  undefined8 uVar117;
  integral_image *iimage_00;
  double local_310;
  int local_2ec;
  int local_2b8;
  int local_2b4;
  int local_2ac;
  int local_2a4;
  float local_2a0;
  float local_29c;
  float local_298;
  float local_294;
  float *local_290;
  int local_284;
  float *local_278;
  int local_270;
  int local_16c;
  int local_168;
  int local_14c;
  int local_148;
  int local_80;
  int local_58;
  int local_54;
  float local_50;
  int local_4c;
  
  fVar41 = in_RSI[2];
  auVar34._8_4_ = 0x80000000;
  auVar34._0_8_ = 0x8000000080000000;
  auVar34._12_4_ = 0x80000000;
  auVar28._8_4_ = 0x3effffff;
  auVar28._0_8_ = 0x3effffff3effffff;
  auVar28._12_4_ = 0x3effffff;
  auVar26 = vpternlogd_avx512vl(auVar28,ZEXT416((uint)fVar41),auVar34,0xf8);
  auVar26 = vroundss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)(fVar41 + auVar26._0_4_)),0xb);
  iVar12 = (int)auVar26._0_4_;
  fVar36 = -0.08 / (fVar41 * fVar41);
  fVar1 = *in_RSI;
  auVar35._8_4_ = 0x80000000;
  auVar35._0_8_ = 0x8000000080000000;
  auVar35._12_4_ = 0x80000000;
  auVar29._8_4_ = 0x3effffff;
  auVar29._0_8_ = 0x3effffff3effffff;
  auVar29._12_4_ = 0x3effffff;
  auVar26 = vpternlogd_avx512vl(auVar29,ZEXT416((uint)fVar1),auVar35,0xf8);
  auVar26 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar26._0_4_)),0xb);
  auVar32._0_8_ = (double)auVar26._0_4_;
  auVar32._8_8_ = 0;
  auVar26._0_8_ = (double)fVar41;
  auVar26._8_8_ = 0;
  auVar26 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar26,auVar32);
  fVar37 = (float)auVar26._0_8_;
  fVar1 = in_RSI[1];
  auVar100._8_4_ = 0x80000000;
  auVar100._0_8_ = 0x8000000080000000;
  auVar100._12_4_ = 0x80000000;
  auVar30._8_4_ = 0x3effffff;
  auVar30._0_8_ = 0x3effffff3effffff;
  auVar30._12_4_ = 0x3effffff;
  auVar26 = vpternlogd_avx512vl(auVar30,ZEXT416((uint)fVar1),auVar100,0xf8);
  auVar26 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar26._0_4_)),0xb);
  auVar33._0_8_ = (double)auVar26._0_4_;
  auVar33._8_8_ = 0;
  auVar27._0_8_ = (double)fVar41;
  auVar27._8_8_ = 0;
  auVar26 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar27,auVar33);
  fVar38 = (float)auVar26._0_8_;
  fVar1 = fVar37 - (float)iVar12;
  fVar2 = (fVar37 - (float)iVar12) + 0.5;
  fVar3 = (fVar38 - (float)iVar12) + 0.5;
  local_4c = 0;
  local_50 = 0.0;
  local_54 = 0;
  auVar26 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar41),
                            ZEXT416((uint)fVar37));
  auVar101._8_4_ = 0x80000000;
  auVar101._0_8_ = 0x8000000080000000;
  auVar101._12_4_ = 0x80000000;
  auVar31._8_4_ = 0x3effffff;
  auVar31._0_8_ = 0x3effffff3effffff;
  auVar31._12_4_ = 0x3effffff;
  auVar27 = vpternlogd_avx512vl(auVar31,auVar26,auVar101,0xf8);
  auVar26 = vroundss_avx(auVar26,ZEXT416((uint)(auVar26._0_4_ + auVar27._0_4_)),0xb);
  auVar54 = ZEXT1664(auVar26);
  if (0 < (int)auVar26._0_4_ - iVar12) {
    auVar26 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar41),
                              ZEXT416((uint)fVar38));
    auVar102._8_4_ = 0x80000000;
    auVar102._0_8_ = 0x8000000080000000;
    auVar102._12_4_ = 0x80000000;
    auVar55._8_4_ = 0x3effffff;
    auVar55._0_8_ = 0x3effffff3effffff;
    auVar55._12_4_ = 0x3effffff;
    auVar27 = vpternlogd_avx512vl(auVar55,auVar26,auVar102,0xf8);
    auVar26 = vroundss_avx(auVar26,ZEXT416((uint)(auVar26._0_4_ + auVar27._0_4_)),0xb);
    auVar54 = ZEXT1664(auVar26);
    if (0 < (int)auVar26._0_4_ - iVar12) {
      auVar26 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar41),
                                ZEXT416((uint)fVar37));
      auVar103._8_4_ = 0x80000000;
      auVar103._0_8_ = 0x8000000080000000;
      auVar103._12_4_ = 0x80000000;
      auVar56._8_4_ = 0x3effffff;
      auVar56._0_8_ = 0x3effffff3effffff;
      auVar56._12_4_ = 0x3effffff;
      auVar27 = vpternlogd_avx512vl(auVar56,auVar26,auVar103,0xf8);
      auVar26 = vroundss_avx(auVar26,ZEXT416((uint)(auVar26._0_4_ + auVar27._0_4_)),0xb);
      auVar54 = ZEXT1664(auVar26);
      if ((int)auVar26._0_4_ + iVar12 <= in_RDI->width) {
        auVar26 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar41),
                                  ZEXT416((uint)fVar38));
        auVar104._8_4_ = 0x80000000;
        auVar104._0_8_ = 0x8000000080000000;
        auVar104._12_4_ = 0x80000000;
        auVar57._8_4_ = 0x3effffff;
        auVar57._0_8_ = 0x3effffff3effffff;
        auVar57._12_4_ = 0x3effffff;
        auVar27 = vpternlogd_avx512vl(auVar57,auVar26,auVar104,0xf8);
        auVar26 = vroundss_avx(auVar26,ZEXT416((uint)(auVar26._0_4_ + auVar27._0_4_)),0xb);
        auVar54 = ZEXT1664(auVar26);
        if ((int)auVar26._0_4_ + iVar12 <= in_RDI->height) {
          local_14c = 0;
          for (local_148 = -0xc; local_148 < 0xc; local_148 = local_148 + 2) {
            iVar13 = local_14c + 1;
            auVar72._0_4_ = (float)local_148;
            auVar72._4_12_ = auVar54._4_12_;
            auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar72,ZEXT416((uint)fVar3));
            iVar14 = (int)auVar26._0_4_;
            auVar73._0_4_ = (float)(local_148 + 1);
            auVar73._4_12_ = auVar26._4_12_;
            auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar73,ZEXT416((uint)fVar3));
            auVar54 = ZEXT1664(auVar26);
            row = (int)auVar26._0_4_;
            local_16c = 0;
            for (local_168 = -0xc; local_168 < 0xc; local_168 = local_168 + 0xc) {
              iVar15 = local_16c + 1;
              iVar16 = local_16c + 2;
              iVar17 = local_16c + 3;
              iVar18 = local_16c + 4;
              iVar19 = local_16c + 5;
              iVar20 = local_16c + 6;
              iVar21 = local_16c + 7;
              iVar22 = local_16c + 8;
              iVar23 = local_16c + 9;
              iVar24 = local_16c + 10;
              iVar25 = local_16c + 0xb;
              auVar74._0_4_ = (float)local_168;
              auVar74._4_12_ = auVar54._4_12_;
              auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar74,ZEXT416((uint)fVar2));
              auVar75._0_4_ = (float)(local_168 + 1);
              auVar75._4_12_ = auVar26._4_12_;
              auVar27 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar75,ZEXT416((uint)fVar2));
              auVar76._0_4_ = (float)(local_168 + 2);
              auVar76._4_12_ = auVar27._4_12_;
              auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar76,ZEXT416((uint)fVar2));
              auVar77._0_4_ = (float)(local_168 + 3);
              auVar77._4_12_ = auVar28._4_12_;
              auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar77,ZEXT416((uint)fVar2));
              auVar78._0_4_ = (float)(local_168 + 4);
              auVar78._4_12_ = auVar29._4_12_;
              auVar30 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar78,ZEXT416((uint)fVar2));
              auVar79._0_4_ = (float)(local_168 + 5);
              auVar79._4_12_ = auVar30._4_12_;
              auVar31 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar79,ZEXT416((uint)fVar2));
              auVar80._0_4_ = (float)(local_168 + 6);
              auVar80._4_12_ = auVar31._4_12_;
              auVar32 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar80,ZEXT416((uint)fVar2));
              auVar81._0_4_ = (float)(local_168 + 7);
              auVar81._4_12_ = auVar32._4_12_;
              auVar33 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar81,ZEXT416((uint)fVar2));
              auVar82._0_4_ = (float)(local_168 + 8);
              auVar82._4_12_ = auVar33._4_12_;
              auVar34 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar82,ZEXT416((uint)fVar2));
              auVar83._0_4_ = (float)(local_168 + 9);
              auVar83._4_12_ = auVar34._4_12_;
              auVar35 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar83,ZEXT416((uint)fVar2));
              auVar84._0_4_ = (float)(local_168 + 10);
              auVar84._4_12_ = auVar35._4_12_;
              auVar100 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar84,ZEXT416((uint)fVar2));
              auVar85._0_4_ = (float)(local_168 + 0xb);
              auVar85._4_12_ = auVar100._4_12_;
              auVar101 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar85,ZEXT416((uint)fVar2));
              auVar54 = ZEXT1664(auVar101);
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar26._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + local_16c),
                         haarResponseY + (local_14c * 0x18 + local_16c));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar26._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + local_16c),
                         haarResponseY + (iVar13 * 0x18 + local_16c));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar27._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + iVar15),
                         haarResponseY + (local_14c * 0x18 + iVar15));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar27._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar15),
                         haarResponseY + (iVar13 * 0x18 + iVar15));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar28._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + iVar16),
                         haarResponseY + (local_14c * 0x18 + iVar16));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar28._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar16),
                         haarResponseY + (iVar13 * 0x18 + iVar16));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar29._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + iVar17),
                         haarResponseY + (local_14c * 0x18 + iVar17));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar29._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar17),
                         haarResponseY + (iVar13 * 0x18 + iVar17));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar30._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + iVar18),
                         haarResponseY + (local_14c * 0x18 + iVar18));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar30._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar18),
                         haarResponseY + (iVar13 * 0x18 + iVar18));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar31._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + iVar19),
                         haarResponseY + (local_14c * 0x18 + iVar19));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar31._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar19),
                         haarResponseY + (iVar13 * 0x18 + iVar19));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar32._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + iVar20),
                         haarResponseY + (local_14c * 0x18 + iVar20));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar32._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar20),
                         haarResponseY + (iVar13 * 0x18 + iVar20));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar33._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + iVar21),
                         haarResponseY + (local_14c * 0x18 + iVar21));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar33._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar21),
                         haarResponseY + (iVar13 * 0x18 + iVar21));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar34._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + iVar22),
                         haarResponseY + (local_14c * 0x18 + iVar22));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar34._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar22),
                         haarResponseY + (iVar13 * 0x18 + iVar22));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar35._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + iVar23),
                         haarResponseY + (local_14c * 0x18 + iVar23));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar35._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar23),
                         haarResponseY + (iVar13 * 0x18 + iVar23));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar100._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + iVar24),
                         haarResponseY + (local_14c * 0x18 + iVar24));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar100._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar24),
                         haarResponseY + (iVar13 * 0x18 + iVar24));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar101._0_4_,iVar12,
                         haarResponseX + (local_14c * 0x18 + iVar25),
                         haarResponseY + (local_14c * 0x18 + iVar25));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar101._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar25),
                         haarResponseY + (iVar13 * 0x18 + iVar25));
              local_16c = local_16c + 0xc;
            }
            local_14c = local_14c + 2;
          }
          goto LAB_001df0b6;
        }
      }
    }
  }
  for (local_58 = -0xc; local_58 < 0xc; local_58 = local_58 + 2) {
    auVar58._0_4_ = (float)local_58;
    auVar58._4_12_ = auVar54._4_12_;
    auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar58,ZEXT416((uint)(fVar38 - (float)iVar12)))
    ;
    auVar59._0_4_ = (float)(local_58 + 1);
    auVar59._4_12_ = auVar26._4_12_;
    auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar59,ZEXT416((uint)(fVar38 - (float)iVar12)))
    ;
    local_310 = 0.5;
    if (auVar26._0_4_ < 0.0) {
      local_310 = -0.5;
    }
    auVar54 = ZEXT864((ulong)((double)auVar26._0_4_ + local_310));
    for (local_80 = -0xc; local_80 < 0xc; local_80 = local_80 + 0xc) {
      auVar60._0_4_ = (float)local_80;
      auVar60._4_12_ = auVar54._4_12_;
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar60,ZEXT416((uint)fVar1));
      auVar61._0_4_ = (float)(local_80 + 1);
      auVar61._4_12_ = auVar26._4_12_;
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar61,ZEXT416((uint)fVar1));
      auVar62._0_4_ = (float)(local_80 + 2);
      auVar62._4_12_ = auVar26._4_12_;
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar62,ZEXT416((uint)fVar1));
      auVar63._0_4_ = (float)(local_80 + 3);
      auVar63._4_12_ = auVar26._4_12_;
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar63,ZEXT416((uint)fVar1));
      auVar64._0_4_ = (float)(local_80 + 4);
      auVar64._4_12_ = auVar26._4_12_;
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar64,ZEXT416((uint)fVar1));
      auVar65._0_4_ = (float)(local_80 + 5);
      auVar65._4_12_ = auVar26._4_12_;
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar65,ZEXT416((uint)fVar1));
      auVar66._0_4_ = (float)(local_80 + 6);
      auVar66._4_12_ = auVar26._4_12_;
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar66,ZEXT416((uint)fVar1));
      auVar67._0_4_ = (float)(local_80 + 7);
      auVar67._4_12_ = auVar26._4_12_;
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar67,ZEXT416((uint)fVar1));
      auVar68._0_4_ = (float)(local_80 + 8);
      auVar68._4_12_ = auVar26._4_12_;
      auVar27 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar68,ZEXT416((uint)fVar1));
      auVar69._0_4_ = (float)(local_80 + 9);
      auVar69._4_12_ = auVar27._4_12_;
      auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar69,ZEXT416((uint)fVar1));
      auVar70._0_4_ = (float)(local_80 + 10);
      auVar70._4_12_ = auVar28._4_12_;
      auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar70,ZEXT416((uint)fVar1));
      auVar71._0_4_ = (float)(local_80 + 0xb);
      auVar71._4_12_ = auVar28._4_12_;
      auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar71,ZEXT416((uint)fVar1));
      iVar13 = (int)((ulong)(double)auVar26._0_4_ >> 0x20);
      uVar117 = 0xbfe0000000000000;
      iimage_00 = (integral_image *)0x3fe0000000000000;
      if (auVar26._0_4_ < 0.0) {
        iimage_00 = (integral_image *)0xbfe0000000000000;
      }
      haarY = (float *)0xbfe0000000000000;
      haarX = (float *)0x3fe0000000000000;
      if (auVar27._0_4_ < 0.0) {
        haarX = (float *)0xbfe0000000000000;
      }
      local_430 = 0.5;
      if (auVar28._0_4_ < 0.0) {
        local_430 = -0.5;
      }
      auVar54 = ZEXT864((ulong)((double)auVar28._0_4_ + local_430));
      haarXY_precheck_boundaries(iimage_00,-0x40200000,0,iVar13,haarX,(float *)0xbfe0000000000000);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar117 >> 0x20),(int)uVar117,iVar13,haarX,haarY);
    }
  }
LAB_001df0b6:
  auVar42._4_12_ = SUB1612(ZEXT816(0x3fe0000000000000),4);
  auVar42._0_4_ = fVar41 * 0.5;
  auVar105._8_4_ = 0x80000000;
  auVar105._0_8_ = 0x8000000080000000;
  auVar105._12_4_ = 0x80000000;
  auVar86._8_4_ = 0x3effffff;
  auVar86._0_8_ = 0x3effffff3effffff;
  auVar86._12_4_ = 0x3effffff;
  auVar26 = vpternlogd_avx512vl(auVar86,auVar42,auVar105,0xf8);
  auVar26 = vroundss_avx(auVar42,ZEXT416((uint)(fVar41 * 0.5 + auVar26._0_4_)),0xb);
  auVar43._4_12_ = SUB1612(ZEXT816(0x3ff8000000000000),4);
  auVar43._0_4_ = fVar41 * 1.5;
  auVar106._8_4_ = 0x80000000;
  auVar106._0_8_ = 0x8000000080000000;
  auVar106._12_4_ = 0x80000000;
  auVar87._8_4_ = 0x3effffff;
  auVar87._0_8_ = 0x3effffff3effffff;
  auVar87._12_4_ = 0x3effffff;
  auVar27 = vpternlogd_avx512vl(auVar87,auVar43,auVar106,0xf8);
  auVar27 = vroundss_avx(auVar43,ZEXT416((uint)(fVar41 * 1.5 + auVar27._0_4_)),0xb);
  auVar44._4_12_ = SUB1612(ZEXT816(0x4004000000000000),4);
  auVar44._0_4_ = fVar41 * 2.5;
  auVar107._8_4_ = 0x80000000;
  auVar107._0_8_ = 0x8000000080000000;
  auVar107._12_4_ = 0x80000000;
  auVar88._8_4_ = 0x3effffff;
  auVar88._0_8_ = 0x3effffff3effffff;
  auVar88._12_4_ = 0x3effffff;
  auVar28 = vpternlogd_avx512vl(auVar88,auVar44,auVar107,0xf8);
  auVar28 = vroundss_avx(auVar44,ZEXT416((uint)(fVar41 * 2.5 + auVar28._0_4_)),0xb);
  fVar39 = auVar28._0_4_;
  auVar45._4_12_ = SUB1612(ZEXT816(0x400c000000000000),4);
  auVar45._0_4_ = fVar41 * 3.5;
  auVar108._8_4_ = 0x80000000;
  auVar108._0_8_ = 0x8000000080000000;
  auVar108._12_4_ = 0x80000000;
  auVar89._8_4_ = 0x3effffff;
  auVar89._0_8_ = 0x3effffff3effffff;
  auVar89._12_4_ = 0x3effffff;
  auVar28 = vpternlogd_avx512vl(auVar89,auVar45,auVar108,0xf8);
  auVar28 = vroundss_avx(auVar45,ZEXT416((uint)(fVar41 * 3.5 + auVar28._0_4_)),0xb);
  auVar46._4_12_ = SUB1612(ZEXT816(0x4012000000000000),4);
  auVar46._0_4_ = fVar41 * 4.5;
  auVar109._8_4_ = 0x80000000;
  auVar109._0_8_ = 0x8000000080000000;
  auVar109._12_4_ = 0x80000000;
  auVar90._8_4_ = 0x3effffff;
  auVar90._0_8_ = 0x3effffff3effffff;
  auVar90._12_4_ = 0x3effffff;
  auVar29 = vpternlogd_avx512vl(auVar90,auVar46,auVar109,0xf8);
  auVar29 = vroundss_avx(auVar46,ZEXT416((uint)(fVar41 * 4.5 + auVar29._0_4_)),0xb);
  auVar47._4_12_ = SUB1612(ZEXT816(0x4016000000000000),4);
  auVar47._0_4_ = fVar41 * 5.5;
  auVar110._8_4_ = 0x80000000;
  auVar110._0_8_ = 0x8000000080000000;
  auVar110._12_4_ = 0x80000000;
  auVar91._8_4_ = 0x3effffff;
  auVar91._0_8_ = 0x3effffff3effffff;
  auVar91._12_4_ = 0x3effffff;
  auVar30 = vpternlogd_avx512vl(auVar91,auVar47,auVar110,0xf8);
  auVar30 = vroundss_avx(auVar47,ZEXT416((uint)(fVar41 * 5.5 + auVar30._0_4_)),0xb);
  auVar48._4_12_ = SUB1612(ZEXT816(0x401a000000000000),4);
  auVar48._0_4_ = fVar41 * 6.5;
  auVar111._8_4_ = 0x80000000;
  auVar111._0_8_ = 0x8000000080000000;
  auVar111._12_4_ = 0x80000000;
  auVar92._8_4_ = 0x3effffff;
  auVar92._0_8_ = 0x3effffff3effffff;
  auVar92._12_4_ = 0x3effffff;
  auVar31 = vpternlogd_avx512vl(auVar92,auVar48,auVar111,0xf8);
  auVar31 = vroundss_avx(auVar48,ZEXT416((uint)(fVar41 * 6.5 + auVar31._0_4_)),0xb);
  auVar49._4_12_ = SUB1612(ZEXT816(0x401e000000000000),4);
  auVar49._0_4_ = fVar41 * 7.5;
  auVar112._8_4_ = 0x80000000;
  auVar112._0_8_ = 0x8000000080000000;
  auVar112._12_4_ = 0x80000000;
  auVar93._8_4_ = 0x3effffff;
  auVar93._0_8_ = 0x3effffff3effffff;
  auVar93._12_4_ = 0x3effffff;
  auVar32 = vpternlogd_avx512vl(auVar93,auVar49,auVar112,0xf8);
  auVar32 = vroundss_avx(auVar49,ZEXT416((uint)(fVar41 * 7.5 + auVar32._0_4_)),0xb);
  fVar40 = auVar32._0_4_;
  auVar50._4_12_ = SUB1612(ZEXT816(0x4021000000000000),4);
  auVar50._0_4_ = fVar41 * 8.5;
  auVar113._8_4_ = 0x80000000;
  auVar113._0_8_ = 0x8000000080000000;
  auVar113._12_4_ = 0x80000000;
  auVar94._8_4_ = 0x3effffff;
  auVar94._0_8_ = 0x3effffff3effffff;
  auVar94._12_4_ = 0x3effffff;
  auVar32 = vpternlogd_avx512vl(auVar94,auVar50,auVar113,0xf8);
  auVar32 = vroundss_avx(auVar50,ZEXT416((uint)(fVar41 * 8.5 + auVar32._0_4_)),0xb);
  auVar51._4_12_ = SUB1612(ZEXT816(0x4023000000000000),4);
  auVar51._0_4_ = fVar41 * 9.5;
  auVar114._8_4_ = 0x80000000;
  auVar114._0_8_ = 0x8000000080000000;
  auVar114._12_4_ = 0x80000000;
  auVar95._8_4_ = 0x3effffff;
  auVar95._0_8_ = 0x3effffff3effffff;
  auVar95._12_4_ = 0x3effffff;
  auVar33 = vpternlogd_avx512vl(auVar95,auVar51,auVar114,0xf8);
  auVar33 = vroundss_avx(auVar51,ZEXT416((uint)(fVar41 * 9.5 + auVar33._0_4_)),0xb);
  auVar52._4_12_ = SUB1612(ZEXT816(0x4025000000000000),4);
  auVar52._0_4_ = fVar41 * 10.5;
  auVar115._8_4_ = 0x80000000;
  auVar115._0_8_ = 0x8000000080000000;
  auVar115._12_4_ = 0x80000000;
  auVar96._8_4_ = 0x3effffff;
  auVar96._0_8_ = 0x3effffff3effffff;
  auVar96._12_4_ = 0x3effffff;
  auVar34 = vpternlogd_avx512vl(auVar96,auVar52,auVar115,0xf8);
  auVar34 = vroundss_avx(auVar52,ZEXT416((uint)(fVar41 * 10.5 + auVar34._0_4_)),0xb);
  auVar53._4_12_ = SUB1612(ZEXT816(0x4027000000000000),4);
  auVar53._0_4_ = fVar41 * 11.5;
  auVar116._8_4_ = 0x80000000;
  auVar116._0_8_ = 0x8000000080000000;
  auVar116._12_4_ = 0x80000000;
  auVar97._8_4_ = 0x3effffff;
  auVar97._0_8_ = 0x3effffff3effffff;
  auVar97._12_4_ = 0x3effffff;
  auVar35 = vpternlogd_avx512vl(auVar97,auVar53,auVar116,0xf8);
  auVar35 = vroundss_avx(auVar53,ZEXT416((uint)(fVar41 * 11.5 + auVar35._0_4_)),0xb);
  fVar41 = fVar39 + auVar27._0_4_;
  fVar1 = fVar39 + auVar26._0_4_;
  fVar2 = fVar39 - auVar26._0_4_;
  fVar3 = fVar39 - auVar27._0_4_;
  fVar37 = fVar39 - auVar28._0_4_;
  fVar38 = fVar39 - auVar29._0_4_;
  fVar4 = fVar39 - auVar30._0_4_;
  fVar39 = fVar39 - auVar31._0_4_;
  fVar5 = fVar40 - auVar28._0_4_;
  fVar6 = fVar40 - auVar29._0_4_;
  fVar7 = fVar40 - auVar30._0_4_;
  fVar8 = fVar40 - auVar31._0_4_;
  fVar9 = fVar40 - auVar32._0_4_;
  fVar10 = fVar40 - auVar33._0_4_;
  fVar11 = fVar40 - auVar34._0_4_;
  fVar40 = fVar40 - auVar35._0_4_;
  gauss_s1_c0[0] = expf(fVar36 * fVar41 * fVar41);
  gauss_s1_c0[1] = expf(fVar36 * fVar1 * fVar1);
  gauss_s1_c0[2] = expf(fVar36 * fVar2 * fVar2);
  gauss_s1_c0[3] = expf(fVar36 * fVar3 * fVar3);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar36 * fVar37 * fVar37);
  gauss_s1_c0[6] = expf(fVar36 * fVar38 * fVar38);
  gauss_s1_c0[7] = expf(fVar36 * fVar4 * fVar4);
  gauss_s1_c0[8] = expf(fVar36 * fVar39 * fVar39);
  gauss_s1_c1[0] = expf(fVar36 * fVar5 * fVar5);
  gauss_s1_c1[1] = expf(fVar36 * fVar6 * fVar6);
  gauss_s1_c1[2] = expf(fVar36 * fVar7 * fVar7);
  gauss_s1_c1[3] = expf(fVar36 * fVar8 * fVar8);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar36 * fVar9 * fVar9);
  gauss_s1_c1[6] = expf(fVar36 * fVar10 * fVar10);
  gauss_s1_c1[7] = expf(fVar36 * fVar11 * fVar11);
  gauss_s1_c1[8] = expf(fVar36 * fVar40 * fVar40);
  for (local_270 = -8; local_270 < 8; local_270 = local_270 + 5) {
    if ((local_270 == -8) || (local_270 == 7)) {
      local_278 = gauss_s1_c1;
    }
    else {
      local_278 = gauss_s1_c0;
    }
    iVar12 = 0;
    if (local_270 < 0) {
      iVar12 = 8;
    }
    iVar13 = 1;
    if (local_270 < 0) {
      iVar13 = -1;
    }
    for (local_284 = -8; local_284 < 8; local_284 = local_284 + 5) {
      if ((local_284 == -8) || (local_284 == 7)) {
        local_290 = gauss_s1_c1;
      }
      else {
        local_290 = gauss_s1_c0;
      }
      local_294 = 0.0;
      local_298 = 0.0;
      local_29c = 0.0;
      local_2a0 = 0.0;
      local_2a4 = 0;
      if (local_284 < 0) {
        local_2a4 = 8;
      }
      iVar14 = 1;
      if (local_284 < 0) {
        iVar14 = -1;
      }
      for (local_2ac = (local_284 + 8) * 0x18;
          SBORROW4(local_2ac,(local_284 + 0x11) * 0x18) !=
          local_2ac + (local_284 + 0x11) * -0x18 < 0; local_2ac = local_2ac + 0x18) {
        local_2b4 = iVar12;
        for (local_2b8 = local_270 + 8; local_2b8 < local_270 + 0x11; local_2b8 = local_2b8 + 1) {
          fVar41 = local_278[local_2b4] * local_290[local_2a4] *
                   haarResponseY[local_2ac + local_2b8];
          fVar1 = local_278[local_2b4] * local_290[local_2a4] * haarResponseX[local_2ac + local_2b8]
          ;
          local_294 = fVar41 + local_294;
          local_298 = fVar1 + local_298;
          auVar98._8_4_ = 0x7fffffff;
          auVar98._0_8_ = 0x7fffffff7fffffff;
          auVar98._12_4_ = 0x7fffffff;
          auVar26 = vpand_avx(ZEXT416((uint)fVar41),auVar98);
          local_29c = auVar26._0_4_ + local_29c;
          auVar99._8_4_ = 0x7fffffff;
          auVar99._0_8_ = 0x7fffffff7fffffff;
          auVar99._12_4_ = 0x7fffffff;
          auVar26 = vpand_avx(ZEXT416((uint)fVar1),auVar99);
          local_2a0 = auVar26._0_4_ + local_2a0;
          local_2b4 = iVar13 + local_2b4;
        }
        local_2a4 = iVar14 + local_2a4;
      }
      fVar41 = gauss_s2_arr[local_54];
      local_54 = local_54 + 1;
      local_294 = local_294 * fVar41;
      local_298 = local_298 * fVar41;
      local_29c = local_29c * fVar41;
      local_2a0 = local_2a0 * fVar41;
      in_RSI[(long)local_4c + 5] = local_294;
      in_RSI[(long)(local_4c + 1) + 5] = local_298;
      in_RSI[(long)(local_4c + 2) + 5] = local_29c;
      in_RSI[(long)(local_4c + 3) + 5] = local_2a0;
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)local_294),ZEXT416((uint)local_294),
                                ZEXT416((uint)(local_298 * local_298)));
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)local_29c),ZEXT416((uint)local_29c),auVar26);
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)local_2a0),ZEXT416((uint)local_2a0),auVar26);
      local_50 = auVar26._0_4_ + local_50;
      local_4c = local_4c + 4;
    }
  }
  fVar41 = sqrtf(local_50);
  for (local_2ec = 0; local_2ec < 0x40; local_2ec = local_2ec + 1) {
    in_RSI[(long)local_2ec + 5] = (1.0 / fVar41) * in_RSI[(long)local_2ec + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_12_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_k8_mul_scale + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_k9_mul_scale + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_k10_mul_scale + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_k11_mul_scale + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}